

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateAccessorDeclarations
          (StringFieldGenerator *this,Printer *printer)

{
  FieldOptions_CType FVar1;
  CType CVar2;
  FieldOptions *this_00;
  undefined1 local_50 [7];
  bool unknown_ctype;
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  this_00 = FieldDescriptor::options((this->super_FieldGenerator).descriptor_);
  FVar1 = FieldOptions::ctype(this_00);
  CVar2 = EffectiveStringCType
                    ((this->super_FieldGenerator).descriptor_,(this->super_FieldGenerator).options_)
  ;
  if (FVar1 != CVar2) {
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50," private:\n  // Hidden due to unknown ctype option.\n");
    Formatter::Indent((Formatter *)local_50);
  }
  Formatter::operator()
            ((Formatter *)local_50,
             "$deprecated_attr$const std::string& ${1$$name$$}$() const;\ntemplate <typename ArgT0 = const std::string&, typename... ArgT>\n$deprecated_attr$void ${1$set_$name$$}$(ArgT0&& arg0, ArgT... args);\n"
             ,&(this->super_FieldGenerator).descriptor_);
  Formatter::operator()
            ((Formatter *)local_50,
             "$deprecated_attr$std::string* ${1$mutable_$name$$}$();\nPROTOBUF_NODISCARD $deprecated_attr$std::string* ${1$$release_name$$}$();\n$deprecated_attr$void ${1$set_allocated_$name$$}$(std::string* $name$);\n"
             ,&(this->super_FieldGenerator).descriptor_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "private:\nconst std::string& _internal_$name$() const;\ninline PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const std::string& value);\nstd::string* _internal_mutable_$name$();\n"
            );
  if ((this->inlined_ & 1U) != 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "inline PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;\n");
  }
  Formatter::operator()<>((Formatter *)local_50,"public:\n");
  if (FVar1 != CVar2) {
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50," public:\n");
    Formatter::Indent((Formatter *)local_50);
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // If we're using StringFieldGenerator for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.

  bool unknown_ctype = descriptor_->options().ctype() !=
                       EffectiveStringCType(descriptor_, options_);

  if (unknown_ctype) {
    format.Outdent();
    format(
        " private:\n"
        "  // Hidden due to unknown ctype option.\n");
    format.Indent();
  }

  format(
      "$deprecated_attr$const std::string& ${1$$name$$}$() const;\n"
      "template <typename ArgT0 = const std::string&, typename... ArgT>\n"
      "$deprecated_attr$void ${1$set_$name$$}$(ArgT0&& arg0, ArgT... args);\n",
      descriptor_);
  format(
      "$deprecated_attr$std::string* ${1$mutable_$name$$}$();\n"
      "PROTOBUF_NODISCARD $deprecated_attr$std::string* "
      "${1$$release_name$$}$();\n"
      "$deprecated_attr$void ${1$set_allocated_$name$$}$(std::string* "
      "$name$);\n",
      descriptor_);
  format(
      "private:\n"
      "const std::string& _internal_$name$() const;\n"
      "inline PROTOBUF_ALWAYS_INLINE void "
      "_internal_set_$name$(const std::string& value);\n"
      "std::string* _internal_mutable_$name$();\n");
  if (inlined_) {
    format(
        "inline PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() "
        "const;\n");
  }
  format("public:\n");

  if (unknown_ctype) {
    format.Outdent();
    format(" public:\n");
    format.Indent();
  }
}